

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::removeChars_abi_cxx11_(string_view source,string_view remchars)

{
  anon_class_16_1_c8ab9501_for__M_pred __pred;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last;
  char *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __last = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_RDI,in_stack_ffffffffffffff88);
  this = &local_18;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::begin(this);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::end(this);
  __result = std::back_inserter<std::__cxx11::string>(in_stack_ffffffffffffff68);
  __pred.remchars._M_str = in_R8;
  __pred.remchars._M_len = in_RCX;
  std::
  remove_copy_if<char_const*,std::back_insert_iterator<std::__cxx11::string>,gmlc::utilities::stringOps::removeChars(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
            (in_stack_ffffffffffffffa0,(char *)__last,__result,__pred);
  return (string *)in_RDI;
}

Assistant:

std::string removeChars(std::string_view source, std::string_view remchars)
    {
        std::string result;
        result.reserve(source.length());
        std::remove_copy_if(
            source.begin(),
            source.end(),
            std::back_inserter(result),
            [remchars](char input) {
                return (
                    std::find(remchars.begin(), remchars.end(), input) !=
                    remchars.end());
            });
        return result;
    }